

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_write_format_zip_empty.c
# Opt level: O1

void test_write_format_zip_empty(void)

{
  int iVar1;
  wchar_t wVar2;
  archive *paVar3;
  archive_entry *ae;
  size_t used;
  char buff [256];
  archive_entry *local_148;
  size_t local_140;
  undefined1 local_138 [264];
  
  paVar3 = archive_write_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_empty.c"
                   ,L'(',(uint)(paVar3 != (archive *)0x0),"(a = archive_write_new()) != NULL",
                   (void *)0x0);
  iVar1 = archive_write_set_format_zip(paVar3);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_empty.c"
                      ,L')',0,"ARCHIVE_OK",(long)iVar1,"archive_write_set_format_zip(a)",paVar3);
  iVar1 = archive_write_add_filter_none(paVar3);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_empty.c"
                      ,L'*',0,"ARCHIVE_OK",(long)iVar1,"archive_write_add_filter_none(a)",paVar3);
  iVar1 = archive_write_set_bytes_per_block(paVar3,1);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_empty.c"
                      ,L'+',0,"ARCHIVE_OK",(long)iVar1,"archive_write_set_bytes_per_block(a, 1)",
                      paVar3);
  iVar1 = archive_write_set_bytes_in_last_block(paVar3,1);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_empty.c"
                      ,L',',0,"ARCHIVE_OK",(long)iVar1,"archive_write_set_bytes_in_last_block(a, 1)"
                      ,paVar3);
  iVar1 = archive_write_open_memory(paVar3,local_138,0x100,&local_140);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_empty.c"
                      ,L'-',0,"ARCHIVE_OK",(long)iVar1,
                      "archive_write_open_memory(a, buff, sizeof(buff), &used)",paVar3);
  iVar1 = archive_write_close(paVar3);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_empty.c"
                      ,L'0',0,"ARCHIVE_OK",(long)iVar1,"archive_write_close(a)",paVar3);
  iVar1 = archive_write_free(paVar3);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_empty.c"
                      ,L'1',0,"ARCHIVE_OK",(long)iVar1,"archive_write_free(a)",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_empty.c"
                      ,L'4',local_140,"used",0x16,"22",(void *)0x0);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_empty.c"
                      ,L'7',local_138,"buff","PK\x05\x06",
                      "\"PK\\005\\006\\0\\0\\0\\0\\0\\0\\0\\0\\0\\0\\0\\0\\0\\0\\0\\0\\0\\0\"",0x16,
                      "22",(void *)0x0);
  paVar3 = archive_read_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_empty.c"
                   ,L'<',(uint)(paVar3 != (archive *)0x0),"(a = archive_read_new()) != NULL",
                   (void *)0x0);
  wVar2 = archive_read_support_format_zip(paVar3);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_empty.c"
                      ,L'=',0,"ARCHIVE_OK",(long)wVar2,"archive_read_support_format_zip(a)",paVar3);
  iVar1 = archive_read_open_memory(paVar3,local_138,0x16);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_empty.c"
                      ,L'>',0,"ARCHIVE_OK",(long)iVar1,"archive_read_open_memory(a, buff, 22)",
                      paVar3);
  iVar1 = archive_read_next_header(paVar3,&local_148);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_empty.c"
                      ,L'?',1,"ARCHIVE_EOF",(long)iVar1,"archive_read_next_header(a, &ae)",paVar3);
  iVar1 = archive_write_free(paVar3);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_empty.c"
                      ,L'@',0,"ARCHIVE_OK",(long)iVar1,"archive_write_free(a)",(void *)0x0);
  paVar3 = archive_read_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_empty.c"
                   ,L'B',(uint)(paVar3 != (archive *)0x0),"(a = archive_read_new()) != NULL",
                   (void *)0x0);
  wVar2 = archive_read_support_format_zip(paVar3);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_empty.c"
                      ,L'C',0,"ARCHIVE_OK",(long)wVar2,"archive_read_support_format_zip(a)",paVar3);
  iVar1 = read_open_memory(paVar3,local_138,0x16,1);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_empty.c"
                      ,L'D',0,"ARCHIVE_OK",(long)iVar1,"read_open_memory(a, buff, 22, 1)",paVar3);
  iVar1 = archive_read_next_header(paVar3,&local_148);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_empty.c"
                      ,L'E',1,"ARCHIVE_EOF",(long)iVar1,"archive_read_next_header(a, &ae)",paVar3);
  iVar1 = archive_write_free(paVar3);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_empty.c"
                      ,L'F',0,"ARCHIVE_OK",(long)iVar1,"archive_write_free(a)",(void *)0x0);
  paVar3 = archive_read_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_empty.c"
                   ,L'H',(uint)(paVar3 != (archive *)0x0),"(a = archive_read_new()) != NULL",
                   (void *)0x0);
  wVar2 = archive_read_support_format_zip(paVar3);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_empty.c"
                      ,L'I',0,"ARCHIVE_OK",(long)wVar2,"archive_read_support_format_zip(a)",paVar3);
  iVar1 = read_open_memory_seek(paVar3,local_138,0x16,0x16);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_empty.c"
                      ,L'J',0,"ARCHIVE_OK",(long)iVar1,"read_open_memory_seek(a, buff, 22, 22)",
                      paVar3);
  iVar1 = archive_read_next_header(paVar3,&local_148);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_empty.c"
                      ,L'K',1,"ARCHIVE_EOF",(long)iVar1,"archive_read_next_header(a, &ae)",paVar3);
  iVar1 = archive_write_free(paVar3);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_empty.c"
                      ,L'L',0,"ARCHIVE_OK",(long)iVar1,"archive_write_free(a)",(void *)0x0);
  return;
}

Assistant:

DEFINE_TEST(test_write_format_zip_empty)
{
	struct archive *a;
	struct archive_entry *ae;
	char buff[256];
	size_t used;

	/* Zip format: Create a new archive in memory. */
	assert((a = archive_write_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_write_set_format_zip(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_write_add_filter_none(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_write_set_bytes_per_block(a, 1));
	assertEqualIntA(a, ARCHIVE_OK, archive_write_set_bytes_in_last_block(a, 1));
	assertEqualIntA(a, ARCHIVE_OK, archive_write_open_memory(a, buff, sizeof(buff), &used));

	/* Close out the archive without writing anything. */
	assertEqualIntA(a, ARCHIVE_OK, archive_write_close(a));
	assertEqualInt(ARCHIVE_OK, archive_write_free(a));

	/* Verify the correct format for an empty Zip archive. */
	assertEqualInt(used, 22);
	assertEqualMem(buff,
	    "PK\005\006\0\0\0\0\0\0\0\0\0\0\0\0\0\0\0\0\0\0",
	    22);

	/* Verify that we read this kind of empty archive correctly. */
	/* Try with the standard memory reader, and with the test
	   memory reader with and without seek support. */
	assert((a = archive_read_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_format_zip(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_open_memory(a, buff, 22));
	assertEqualIntA(a, ARCHIVE_EOF, archive_read_next_header(a, &ae));
	assertEqualInt(ARCHIVE_OK, archive_write_free(a));

	assert((a = archive_read_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_format_zip(a));
	assertEqualIntA(a, ARCHIVE_OK, read_open_memory(a, buff, 22, 1));
	assertEqualIntA(a, ARCHIVE_EOF, archive_read_next_header(a, &ae));
	assertEqualInt(ARCHIVE_OK, archive_write_free(a));

	assert((a = archive_read_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_format_zip(a));
	assertEqualIntA(a, ARCHIVE_OK, read_open_memory_seek(a, buff, 22, 22));
	assertEqualIntA(a, ARCHIVE_EOF, archive_read_next_header(a, &ae));
	assertEqualInt(ARCHIVE_OK, archive_write_free(a));
}